

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  RTCFilterFunctionN p_Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar43;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar44 [32];
  undefined1 auVar48 [16];
  uint uVar49;
  uint uVar50;
  uint uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar64 [64];
  undefined1 local_14d8 [16];
  Geometry *local_14c0;
  ulong local_14b8;
  ulong local_14b0;
  long local_14a8;
  ulong local_14a0;
  NodeRef *local_1498;
  long local_1490;
  RTCFilterFunctionNArguments args;
  float old_t;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  byte local_13d7;
  float local_13c8 [4];
  undefined1 local_13b8 [16];
  float local_13a8 [4];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  RTCHitN local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  uint local_12f8;
  uint uStack_12f4;
  uint uStack_12f0;
  uint uStack_12ec;
  uint uStack_12e8;
  uint uStack_12e4;
  uint uStack_12e0;
  uint uStack_12dc;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  local_1498 = stack + 1;
  stack[0] = root;
  auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar53 = ZEXT3264(auVar40);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar54 = ZEXT3264(auVar41);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar55 = ZEXT3264(auVar42);
  auVar27 = vmulss_avx512f(auVar40._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar40._0_4_ = auVar27._0_4_;
  auVar40._4_4_ = auVar40._0_4_;
  auVar40._8_4_ = auVar40._0_4_;
  auVar40._12_4_ = auVar40._0_4_;
  auVar40._16_4_ = auVar40._0_4_;
  auVar40._20_4_ = auVar40._0_4_;
  auVar40._24_4_ = auVar40._0_4_;
  auVar40._28_4_ = auVar40._0_4_;
  auVar27 = vmulss_avx512f(auVar41._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar41._0_4_ = auVar27._0_4_;
  auVar41._4_4_ = auVar41._0_4_;
  auVar41._8_4_ = auVar41._0_4_;
  auVar41._12_4_ = auVar41._0_4_;
  auVar41._16_4_ = auVar41._0_4_;
  auVar41._20_4_ = auVar41._0_4_;
  auVar41._24_4_ = auVar41._0_4_;
  auVar41._28_4_ = auVar41._0_4_;
  auVar27 = vmulss_avx512f(auVar42._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar42._0_4_ = auVar27._0_4_;
  auVar42._4_4_ = auVar42._0_4_;
  auVar42._8_4_ = auVar42._0_4_;
  auVar42._12_4_ = auVar42._0_4_;
  auVar42._16_4_ = auVar42._0_4_;
  auVar42._20_4_ = auVar42._0_4_;
  auVar42._24_4_ = auVar42._0_4_;
  auVar42._28_4_ = auVar42._0_4_;
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar24 = uVar21 ^ 0x20;
  auVar44._8_4_ = 0x80000000;
  auVar44._0_8_ = 0x8000000080000000;
  auVar44._12_4_ = 0x80000000;
  auVar44._16_4_ = 0x80000000;
  auVar44._20_4_ = 0x80000000;
  auVar44._24_4_ = 0x80000000;
  auVar44._28_4_ = 0x80000000;
  auVar40 = vxorps_avx512vl(auVar40,auVar44);
  auVar56 = ZEXT3264(auVar40);
  auVar40 = vxorps_avx512vl(auVar41,auVar44);
  auVar57 = ZEXT3264(auVar40);
  auVar40 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar58 = ZEXT3264(auVar40);
  auVar40 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar59 = ZEXT3264(auVar40);
  auVar40 = vxorps_avx512vl(auVar42,auVar44);
  auVar60 = ZEXT3264(auVar40);
  auVar27 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar61 = ZEXT1664(auVar27);
  bVar26 = true;
  auVar27 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar62 = ZEXT1664(auVar27);
  auVar27 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar63 = ZEXT1664(auVar27);
  auVar27 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar64 = ZEXT1664(auVar27);
  local_14a0 = uVar21;
  do {
    uVar22 = local_1498[-1].ptr;
    local_1498 = local_1498 + -1;
    while ((uVar22 & 8) == 0) {
      auVar40 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar22 + 0x40 + uVar21),auVar56._0_32_,
                           auVar53._0_32_);
      auVar41 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar22 + 0x40 + uVar18),auVar57._0_32_,
                           auVar54._0_32_);
      auVar40 = vpmaxsd_avx2(auVar40,auVar41);
      auVar41 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar22 + 0x40 + uVar23),auVar60._0_32_,
                           auVar55._0_32_);
      auVar41 = vpmaxsd_avx512vl(auVar41,auVar58._0_32_);
      auVar40 = vpmaxsd_avx2(auVar40,auVar41);
      auVar41 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar22 + 0x40 + uVar24),auVar56._0_32_,
                           auVar53._0_32_);
      auVar42 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar22 + 0x40 + (uVar18 ^ 0x20)),auVar57._0_32_,
                           auVar54._0_32_);
      auVar41 = vpminsd_avx2(auVar41,auVar42);
      auVar42 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar22 + 0x40 + (uVar23 ^ 0x20)),auVar60._0_32_,
                           auVar55._0_32_);
      auVar42 = vpminsd_avx512vl(auVar42,auVar59._0_32_);
      auVar41 = vpminsd_avx2(auVar41,auVar42);
      uVar19 = vpcmpd_avx512vl(auVar40,auVar41,2);
      if ((char)uVar19 == '\0') {
        bVar26 = local_1498 != stack;
        goto joined_r0x00783d6f;
      }
      uVar16 = uVar22 & 0xfffffffffffffff0;
      lVar17 = 0;
      for (uVar22 = uVar19; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        lVar17 = lVar17 + 1;
      }
      uVar22 = *(ulong *)(uVar16 + lVar17 * 8);
      uVar20 = (uint)uVar19 - 1 & (uint)uVar19;
      uVar19 = (ulong)uVar20;
      if (uVar20 != 0) {
        local_1498->ptr = uVar22;
        lVar17 = 0;
        for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
          lVar17 = lVar17 + 1;
        }
        uVar20 = uVar20 - 1 & uVar20;
        uVar19 = (ulong)uVar20;
        bVar25 = uVar20 == 0;
        while( true ) {
          local_1498 = local_1498 + 1;
          uVar22 = *(ulong *)(uVar16 + lVar17 * 8);
          if (bVar25) break;
          local_1498->ptr = uVar22;
          lVar17 = 0;
          for (uVar22 = uVar19; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
            lVar17 = lVar17 + 1;
          }
          uVar19 = uVar19 - 1 & uVar19;
          bVar25 = uVar19 == 0;
        }
      }
    }
    local_1490 = (ulong)((uint)uVar22 & 0xf) - 8;
    if (local_1490 != 0) {
      uVar22 = uVar22 & 0xfffffffffffffff0;
      local_14a8 = 0;
      do {
        lVar17 = local_14a8 * 0x50;
        pSVar5 = context->scene;
        ppfVar6 = (pSVar5->vertices).items;
        pfVar7 = ppfVar6[*(uint *)(uVar22 + 0x30 + lVar17)];
        pfVar8 = ppfVar6[*(uint *)(uVar22 + 0x34 + lVar17)];
        pfVar9 = ppfVar6[*(uint *)(uVar22 + 0x38 + lVar17)];
        pfVar10 = ppfVar6[*(uint *)(uVar22 + 0x3c + lVar17)];
        auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar22 + lVar17)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar22 + 8 + lVar17)));
        auVar27 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar22 + lVar17)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar22 + 8 + lVar17)));
        auVar48 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar22 + 4 + lVar17)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar22 + 0xc + lVar17)));
        auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar22 + 4 + lVar17)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar22 + 0xc + lVar17)));
        auVar33 = vunpcklps_avx(auVar27,auVar39);
        auVar31 = vunpcklps_avx(auVar38,auVar48);
        auVar32 = vunpckhps_avx(auVar38,auVar48);
        auVar38 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar22 + 0x10 + lVar17)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar22 + 0x18 + lVar17)));
        auVar27 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar22 + 0x10 + lVar17)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar22 + 0x18 + lVar17)));
        auVar48 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar22 + 0x14 + lVar17)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar22 + 0x1c + lVar17)))
        ;
        auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar22 + 0x14 + lVar17)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar22 + 0x1c + lVar17)))
        ;
        auVar36 = vunpcklps_avx(auVar27,auVar39);
        auVar30 = vunpcklps_avx(auVar38,auVar48);
        auVar39 = vunpckhps_avx(auVar38,auVar48);
        auVar48 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar22 + 0x20 + lVar17)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar22 + 0x28 + lVar17)));
        auVar27 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar22 + 0x20 + lVar17)),
                                *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar22 + 0x28 + lVar17)));
        auVar37 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar22 + 0x24 + lVar17)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar22 + 0x2c + lVar17)))
        ;
        auVar38 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar22 + 0x24 + lVar17)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar22 + 0x2c + lVar17)))
        ;
        auVar28 = vunpcklps_avx(auVar27,auVar38);
        auVar29 = vunpcklps_avx(auVar48,auVar37);
        puVar1 = (undefined8 *)(uVar22 + 0x30 + lVar17);
        local_1428 = *puVar1;
        uStack_1420 = puVar1[1];
        auVar37 = vunpckhps_avx(auVar48,auVar37);
        puVar1 = (undefined8 *)(uVar22 + 0x40 + lVar17);
        local_1438 = *puVar1;
        uStack_1430 = puVar1[1];
        auVar27 = vsubps_avx(auVar31,auVar30);
        auVar39 = vsubps_avx(auVar32,auVar39);
        auVar38 = vsubps_avx(auVar33,auVar36);
        auVar48 = vsubps_avx(auVar29,auVar31);
        auVar37 = vsubps_avx(auVar37,auVar32);
        auVar36 = vsubps_avx(auVar28,auVar33);
        auVar28._0_4_ = auVar39._0_4_ * auVar36._0_4_;
        auVar28._4_4_ = auVar39._4_4_ * auVar36._4_4_;
        auVar28._8_4_ = auVar39._8_4_ * auVar36._8_4_;
        auVar28._12_4_ = auVar39._12_4_ * auVar36._12_4_;
        local_1398 = vfmsub231ps_fma(auVar28,auVar37,auVar38);
        auVar29._0_4_ = auVar38._0_4_ * auVar48._0_4_;
        auVar29._4_4_ = auVar38._4_4_ * auVar48._4_4_;
        auVar29._8_4_ = auVar38._8_4_ * auVar48._8_4_;
        auVar29._12_4_ = auVar38._12_4_ * auVar48._12_4_;
        local_1388 = vfmsub231ps_fma(auVar29,auVar36,auVar27);
        auVar34._0_4_ = auVar27._0_4_ * auVar37._0_4_;
        auVar34._4_4_ = auVar27._4_4_ * auVar37._4_4_;
        auVar34._8_4_ = auVar27._8_4_ * auVar37._8_4_;
        auVar34._12_4_ = auVar27._12_4_ * auVar37._12_4_;
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar52._4_4_ = uVar2;
        auVar52._0_4_ = uVar2;
        auVar52._8_4_ = uVar2;
        auVar52._12_4_ = uVar2;
        auVar28 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
        auVar29 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
        uVar2 = *(undefined4 *)(ray + k * 4);
        auVar30._4_4_ = uVar2;
        auVar30._0_4_ = uVar2;
        auVar30._8_4_ = uVar2;
        auVar30._12_4_ = uVar2;
        auVar30 = vsubps_avx512vl(auVar31,auVar30);
        local_1378 = vfmsub231ps_fma(auVar34,auVar48,auVar39);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar31._4_4_ = uVar2;
        auVar31._0_4_ = uVar2;
        auVar31._8_4_ = uVar2;
        auVar31._12_4_ = uVar2;
        auVar31 = vsubps_avx512vl(auVar32,auVar31);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar32._4_4_ = uVar2;
        auVar32._0_4_ = uVar2;
        auVar32._8_4_ = uVar2;
        auVar32._12_4_ = uVar2;
        auVar32 = vsubps_avx512vl(auVar33,auVar32);
        auVar33 = vmulps_avx512vl(auVar28,auVar32);
        auVar33 = vfmsub231ps_avx512vl(auVar33,auVar31,auVar29);
        auVar34 = vmulps_avx512vl(auVar29,auVar30);
        auVar34 = vfmsub231ps_avx512vl(auVar34,auVar32,auVar52);
        auVar35 = vmulps_avx512vl(auVar52,auVar31);
        auVar35 = vfmsub231ps_avx512vl(auVar35,auVar30,auVar28);
        auVar29 = vmulps_avx512vl(local_1378,auVar29);
        auVar28 = vfmadd231ps_avx512vl(auVar29,local_1388,auVar28);
        auVar28 = vfmadd231ps_avx512vl(auVar28,local_1398,auVar52);
        local_13e8 = vandps_avx512vl(auVar28,auVar62._0_16_);
        auVar29 = vandps_avx512vl(auVar28,auVar63._0_16_);
        auVar36 = vmulps_avx512vl(auVar36,auVar35);
        auVar37 = vfmadd231ps_avx512vl(auVar36,auVar34,auVar37);
        auVar48 = vfmadd231ps_fma(auVar37,auVar33,auVar48);
        uVar20 = auVar29._0_4_;
        local_1418._0_4_ = (float)(uVar20 ^ auVar48._0_4_);
        uVar49 = auVar29._4_4_;
        local_1418._4_4_ = (float)(uVar49 ^ auVar48._4_4_);
        uVar50 = auVar29._8_4_;
        local_1418._8_4_ = (float)(uVar50 ^ auVar48._8_4_);
        uVar51 = auVar29._12_4_;
        local_1418._12_4_ = (float)(uVar51 ^ auVar48._12_4_);
        auVar38 = vmulps_avx512vl(auVar38,auVar35);
        auVar39 = vfmadd231ps_avx512vl(auVar38,auVar39,auVar34);
        auVar27 = vfmadd231ps_fma(auVar39,auVar27,auVar33);
        local_1408._0_4_ = (float)(uVar20 ^ auVar27._0_4_);
        local_1408._4_4_ = (float)(uVar49 ^ auVar27._4_4_);
        local_1408._8_4_ = (float)(uVar50 ^ auVar27._8_4_);
        local_1408._12_4_ = (float)(uVar51 ^ auVar27._12_4_);
        auVar27 = auVar64._0_16_;
        uVar12 = vcmpps_avx512vl(local_1418,auVar27,5);
        uVar13 = vcmpps_avx512vl(local_1408,auVar27,5);
        uVar14 = vcmpps_avx512vl(auVar28,auVar27,4);
        auVar27._0_4_ = local_1418._0_4_ + local_1408._0_4_;
        auVar27._4_4_ = local_1418._4_4_ + local_1408._4_4_;
        auVar27._8_4_ = local_1418._8_4_ + local_1408._8_4_;
        auVar27._12_4_ = local_1418._12_4_ + local_1408._12_4_;
        uVar15 = vcmpps_avx512vl(auVar27,local_13e8,2);
        local_13d7 = (byte)uVar12 & (byte)uVar13 & (byte)uVar14 & (byte)uVar15;
        if (local_13d7 != 0) {
          auVar38._0_4_ = auVar32._0_4_ * local_1378._0_4_;
          auVar38._4_4_ = auVar32._4_4_ * local_1378._4_4_;
          auVar38._8_4_ = auVar32._8_4_ * local_1378._8_4_;
          auVar38._12_4_ = auVar32._12_4_ * local_1378._12_4_;
          auVar27 = vfmadd213ps_fma(auVar31,local_1388,auVar38);
          auVar27 = vfmadd213ps_fma(auVar30,local_1398,auVar27);
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar39._4_4_ = uVar2;
          auVar39._0_4_ = uVar2;
          auVar39._8_4_ = uVar2;
          auVar39._12_4_ = uVar2;
          auVar39 = vmulps_avx512vl(local_13e8,auVar39);
          fVar3 = *(float *)(ray + k * 4 + 0x80);
          local_13f8._0_4_ = (float)(uVar20 ^ auVar27._0_4_);
          local_13f8._4_4_ = (float)(uVar49 ^ auVar27._4_4_);
          local_13f8._8_4_ = (float)(uVar50 ^ auVar27._8_4_);
          local_13f8._12_4_ = (float)(uVar51 ^ auVar27._12_4_);
          auVar48._0_4_ = fVar3 * local_13e8._0_4_;
          auVar48._4_4_ = fVar3 * local_13e8._4_4_;
          auVar48._8_4_ = fVar3 * local_13e8._8_4_;
          auVar48._12_4_ = fVar3 * local_13e8._12_4_;
          uVar12 = vcmpps_avx512vl(local_13f8,auVar48,2);
          uVar13 = vcmpps_avx512vl(auVar39,local_13f8,1);
          local_13d7 = (byte)uVar12 & (byte)uVar13 & local_13d7;
          if (local_13d7 != 0) {
            auVar27 = vrcp14ps_avx512vl(local_13e8);
            auVar37._8_4_ = 0x3f800000;
            auVar37._0_8_ = 0x3f8000003f800000;
            auVar37._12_4_ = 0x3f800000;
            auVar39 = vfnmadd213ps_avx512vl(local_13e8,auVar27,auVar37);
            auVar27 = vfmadd132ps_fma(auVar39,auVar27,auVar27);
            fVar43 = auVar27._0_4_;
            fVar45 = auVar27._4_4_;
            fVar46 = auVar27._8_4_;
            fVar47 = auVar27._12_4_;
            local_13a8[0] = fVar43 * local_13f8._0_4_;
            local_13a8[1] = fVar45 * local_13f8._4_4_;
            local_13a8[2] = fVar46 * local_13f8._8_4_;
            local_13a8[3] = fVar47 * local_13f8._12_4_;
            local_13c8[0] = fVar43 * local_1418._0_4_;
            local_13c8[1] = fVar45 * local_1418._4_4_;
            local_13c8[2] = fVar46 * local_1418._8_4_;
            local_13c8[3] = fVar47 * local_1418._12_4_;
            local_13b8._0_4_ = fVar43 * local_1408._0_4_;
            local_13b8._4_4_ = fVar45 * local_1408._4_4_;
            local_13b8._8_4_ = fVar46 * local_1408._8_4_;
            local_13b8._12_4_ = fVar47 * local_1408._12_4_;
            local_14b0 = (ulong)local_13d7;
            do {
              auVar27 = auVar64._0_16_;
              local_14b8 = 0;
              for (uVar21 = local_14b0; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000
                  ) {
                local_14b8 = local_14b8 + 1;
              }
              local_14c0 = (pSVar5->geometries).items[*(uint *)((long)&local_1428 + local_14b8 * 4)]
                           .ptr;
              if ((local_14c0->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                local_14b0 = local_14b0 ^ 1L << (local_14b8 & 0x3f);
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (local_14c0->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_007843f6:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar26;
                }
                local_12d8 = auVar60._0_32_;
                local_12b8 = vmovdqu64_avx512vl(auVar59._0_32_);
                local_1298 = vmovdqu64_avx512vl(auVar58._0_32_);
                local_1278 = auVar57._0_32_;
                local_1258 = auVar56._0_32_;
                local_1238 = auVar55._0_32_;
                local_1218 = auVar54._0_32_;
                local_11f8 = auVar53._0_32_;
                uVar21 = (ulong)(uint)((int)local_14b8 * 4);
                uVar2 = *(undefined4 *)((long)local_13c8 + uVar21);
                local_1338._4_4_ = uVar2;
                local_1338._0_4_ = uVar2;
                local_1338._8_4_ = uVar2;
                local_1338._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_13b8 + uVar21);
                local_1328._4_4_ = uVar2;
                local_1328._0_4_ = uVar2;
                local_1328._8_4_ = uVar2;
                local_1328._12_4_ = uVar2;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_13a8 + uVar21);
                args.context = context->user;
                local_1308 = vpbroadcastd_avx512vl();
                uVar2 = *(undefined4 *)((long)&local_1438 + uVar21);
                local_1318._4_4_ = uVar2;
                local_1318._0_4_ = uVar2;
                local_1318._8_4_ = uVar2;
                local_1318._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_1398 + uVar21);
                uVar4 = *(undefined4 *)(local_1388 + uVar21);
                local_1358._4_4_ = uVar4;
                local_1358._0_4_ = uVar4;
                local_1358._8_4_ = uVar4;
                local_1358._12_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_1378 + uVar21);
                local_1348._4_4_ = uVar4;
                local_1348._0_4_ = uVar4;
                local_1348._8_4_ = uVar4;
                local_1348._12_4_ = uVar4;
                local_1368[0] = (RTCHitN)(char)uVar2;
                local_1368[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_1368[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_1368[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                local_1368[4] = (RTCHitN)(char)uVar2;
                local_1368[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_1368[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_1368[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                local_1368[8] = (RTCHitN)(char)uVar2;
                local_1368[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_1368[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_1368[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                local_1368[0xc] = (RTCHitN)(char)uVar2;
                local_1368[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                local_1368[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                local_1368[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                vpcmpeqd_avx2(ZEXT1632(local_1308),ZEXT1632(local_1308));
                uStack_12f4 = (args.context)->instID[0];
                local_12f8 = uStack_12f4;
                uStack_12f0 = uStack_12f4;
                uStack_12ec = uStack_12f4;
                uStack_12e8 = (args.context)->instPrimID[0];
                uStack_12e4 = uStack_12e8;
                uStack_12e0 = uStack_12e8;
                uStack_12dc = uStack_12e8;
                auVar38 = auVar61._0_16_;
                local_14d8 = vmovdqa64_avx512vl(auVar38);
                args.valid = (int *)local_14d8;
                args.geometryUserPtr = local_14c0->userPtr;
                args.hit = local_1368;
                args.N = 4;
                auVar39 = vmovdqa64_avx512vl(auVar38);
                auVar38 = vmovdqa64_avx512vl(auVar38);
                args.ray = (RTCRayN *)ray;
                if (local_14c0->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*local_14c0->occlusionFilterN)(&args);
                  auVar38 = local_14d8;
                }
                uVar21 = vptestmd_avx512vl(auVar38,auVar38);
                if ((uVar21 & 0xf) != 0) {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((local_14c0->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var11)(&args);
                    auVar38 = local_14d8;
                  }
                  uVar21 = vptestmd_avx512vl(auVar38,auVar38);
                  uVar21 = uVar21 & 0xf;
                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar25 = (bool)((byte)uVar21 & 1);
                  auVar36._0_4_ =
                       (uint)bVar25 * auVar38._0_4_ | (uint)!bVar25 * *(int *)(args.ray + 0x80);
                  bVar25 = (bool)((byte)(uVar21 >> 1) & 1);
                  auVar36._4_4_ =
                       (uint)bVar25 * auVar38._4_4_ | (uint)!bVar25 * *(int *)(args.ray + 0x84);
                  bVar25 = (bool)((byte)(uVar21 >> 2) & 1);
                  auVar36._8_4_ =
                       (uint)bVar25 * auVar38._8_4_ | (uint)!bVar25 * *(int *)(args.ray + 0x88);
                  bVar25 = SUB81(uVar21 >> 3,0);
                  auVar36._12_4_ =
                       (uint)bVar25 * auVar38._12_4_ | (uint)!bVar25 * *(int *)(args.ray + 0x8c);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar36;
                  if ((byte)uVar21 != 0) goto LAB_007843f6;
                }
                *(float *)(ray + k * 4 + 0x80) = fVar3;
                local_14b0 = local_14b0 ^ 1L << (local_14b8 & 0x3f);
                auVar53 = ZEXT3264(local_11f8);
                auVar54 = ZEXT3264(local_1218);
                auVar55 = ZEXT3264(local_1238);
                auVar56 = ZEXT3264(local_1258);
                auVar57 = ZEXT3264(local_1278);
                auVar40 = vmovdqu64_avx512vl(local_1298);
                auVar58 = ZEXT3264(auVar40);
                auVar40 = vmovdqu64_avx512vl(local_12b8);
                auVar59 = ZEXT3264(auVar40);
                auVar60 = ZEXT3264(local_12d8);
                auVar39 = vmovdqa64_avx512vl(auVar39);
                auVar61 = ZEXT1664(auVar39);
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar62 = ZEXT1664(auVar39);
                auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar63 = ZEXT1664(auVar39);
                auVar27 = vxorps_avx512vl(auVar27,auVar27);
                auVar64 = ZEXT1664(auVar27);
              }
            } while (local_14b0 != 0);
          }
        }
        local_14a8 = local_14a8 + 1;
      } while (local_14a8 != local_1490);
    }
    bVar26 = local_1498 != stack;
    uVar21 = local_14a0;
joined_r0x00783d6f:
    if (!bVar26) {
      return bVar26;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }